

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall_Test::
testBody(TEST_MockComparatorCopierTest_customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString SStack_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  MyTypeForTestingComparator comparator;
  MyTypeForTestingCopier copier;
  
  MyTypeForTesting::MyTypeForTesting(&expectedObject1,0x2d);
  MyTypeForTesting::MyTypeForTesting(&actualObject1,0x2d);
  MyTypeForTesting::MyTypeForTesting(&expectedObject2,0x3ae01ac3);
  MyTypeForTesting::MyTypeForTesting(&actualObject2,0);
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002bc998;
  comparator.super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (MockNamedValueComparator)&PTR__MockNamedValueComparator_002bc4a0;
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_b8,&copier);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&SStack_c8);
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_b8,&comparator);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&SStack_c8);
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_78,"MyTypeForTesting");
  SimpleString::SimpleString(&local_88,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_78,&local_88,
                              &expectedObject1);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"bar");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_98,&local_a8,&expectedObject2);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&SStack_c8);
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_78,"MyTypeForTesting");
  SimpleString::SimpleString(&local_88,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_78,&local_88,
                              &actualObject1);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"bar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_98,&local_a8,&actualObject2);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&SStack_c8);
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_c8);
  iVar1 = (int)&SStack_c8;
  if (*expectedObject1.value == 0x2d) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1a9,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&SStack_c8);
    ::StringFrom((long)&local_b8);
    pcVar7 = SimpleString::asCharString(&local_b8);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1a9,pTVar5);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString(&SStack_c8);
  }
  if (*actualObject1.value == 0x2d) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1aa,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&SStack_c8);
    ::StringFrom((long)&local_b8);
    pcVar7 = SimpleString::asCharString(&local_b8);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1aa,pTVar5);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString(&SStack_c8);
  }
  if (*expectedObject2.value == 0x3ae01ac3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ab,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&SStack_c8);
    ::StringFrom((long)&local_b8);
    pcVar7 = SimpleString::asCharString(&local_b8);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ab,pTVar5);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString(&SStack_c8);
  }
  if (*actualObject2.value == 0x3ae01ac3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ac,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&SStack_c8);
    ::StringFrom((long)&local_b8);
    pcVar7 = SimpleString::asCharString(&local_b8);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x1ac,pTVar5);
    SimpleString::~SimpleString(&local_b8);
    SimpleString::~SimpleString(&SStack_c8);
  }
  SimpleString::SimpleString(&SStack_c8,"");
  pMVar2 = mock(&SStack_c8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&SStack_c8);
  MyTypeForTesting::~MyTypeForTesting(&actualObject2);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject2);
  MyTypeForTesting::~MyTypeForTesting(&actualObject1);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputAndInputParameterOfSameTypeInSameFunctionCall)
{
    MyTypeForTesting expectedObject1(45);
    MyTypeForTesting actualObject1(45);
    MyTypeForTesting expectedObject2(987765443);
    MyTypeForTesting actualObject2(0);
    MyTypeForTestingCopier copier;
    MyTypeForTestingComparator comparator;
    mock().installCopier("MyTypeForTesting", copier);
    mock().installComparator("MyTypeForTesting", comparator);

    mock().expectOneCall("foo")
          .withParameterOfType("MyTypeForTesting", "bar", &expectedObject1)
          .withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject2);
    mock().actualCall("foo")
          .withParameterOfType("MyTypeForTesting", "bar", &actualObject1)
          .withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject2);

    mock().checkExpectations();
    CHECK_EQUAL(45, *(expectedObject1.value));
    CHECK_EQUAL(45, *(actualObject1.value));
    CHECK_EQUAL(987765443, *(expectedObject2.value));
    CHECK_EQUAL(987765443, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}